

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,PassRunner *runner)

{
  MixedArena *pMVar1;
  
  this->_vptr_PassRunner = (_func_int **)&PTR__PassRunner_00e1d568;
  pMVar1 = runner->allocator;
  this->wasm = runner->wasm;
  this->allocator = pMVar1;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PassOptions::PassOptions(&this->options,&runner->options);
  this->isNested = true;
  this->addedPassesRemovedDWARF = false;
  this->ran = false;
  (this->skippedPasses)._M_h._M_buckets = &(this->skippedPasses)._M_h._M_single_bucket;
  (this->skippedPasses)._M_h._M_bucket_count = 1;
  (this->skippedPasses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->skippedPasses)._M_h._M_element_count = 0;
  (this->skippedPasses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->skippedPasses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->skippedPasses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit PassRunner(const PassRunner* runner)
    : wasm(runner->wasm), allocator(runner->allocator),
      options(runner->options), isNested(true) {}